

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

string * __thiscall mp::SolverOption::format_description_abi_cxx11_(SolverOption *this,int indent)

{
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RDI;
  MemoryWriter writer;
  allocator<char> *in_stack_fffffffffffffda8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  allocator<char> local_241 [5];
  int in_stack_fffffffffffffdc4;
  MemoryWriter *in_stack_fffffffffffffdc8;
  SolverOption *in_stack_fffffffffffffdd0;
  
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<char>::~allocator(local_241);
  format_description(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
  fmt::BasicWriter<char>::str_abi_cxx11_(&in_stack_fffffffffffffdc8->super_BasicWriter<char>);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string format_description(int indent=0) const {
    fmt::MemoryWriter writer;
    format_description(writer, indent);
    return writer.str();
  }